

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O1

int CivetServer::authHandler(mg_connection *conn,void *cbdata)

{
  void *pvVar1;
  pointer pcVar2;
  byte bVar3;
  mg_request_info *pmVar4;
  mapped_type *pmVar5;
  uint uVar6;
  mg_connection *local_20;
  
  local_20 = conn;
  pmVar4 = mg_get_request_info(conn);
  pvVar1 = pmVar4->user_data;
  uVar6 = 0;
  if (*(mg_context **)((long)pvVar1 + 8) != (mg_context *)0x0) {
    mg_lock_context(*(mg_context **)((long)pvVar1 + 8));
    pmVar5 = std::
             map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
             ::operator[]((map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
                           *)((long)pvVar1 + 0x10),&local_20);
    pcVar2 = (pmVar5->postData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (pmVar5->postData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pmVar5->postData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pmVar5->postData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pcVar2 != (pointer)0x0) {
      operator_delete(pcVar2);
    }
    mg_unlock_context(*(mg_context **)((long)pvVar1 + 8));
    uVar6 = 0;
    if (cbdata != (void *)0x0) {
      bVar3 = (**(code **)(*cbdata + 0x10))(cbdata,pvVar1,local_20);
      uVar6 = (uint)bVar3;
    }
  }
  return uVar6;
}

Assistant:

int
CivetServer::authHandler(struct mg_connection *conn, void *cbdata)
{
	const struct mg_request_info *request_info = mg_get_request_info(conn);
	assert(request_info != NULL);
	CivetServer *me = (CivetServer *)(request_info->user_data);
	assert(me != NULL);

	// Happens when a request hits the server before the context is saved
	if (me->context == NULL)
		return 0;

	mg_lock_context(me->context);
	me->connections[conn] = CivetConnection();
	mg_unlock_context(me->context);

	CivetAuthHandler *handler = (CivetAuthHandler *)cbdata;

	if (handler) {
		return handler->authorize(me, conn) ? 1 : 0;
	}

	return 0; // No handler found
}